

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::reset
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> guard;
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
  std::shared_ptr<std::exception>::shared_ptr((shared_ptr<std::exception> *)0x2a56ba);
  std::shared_ptr<std::exception>::operator=
            ((shared_ptr<std::exception> *)in_stack_ffffffffffffffd0,
             (shared_ptr<std::exception> *)in_RDI);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x2a56d6);
  in_RDI[1].super___mutex_base._M_mutex.__data.__owner = 0;
  in_RDI[1].super___mutex_base._M_mutex.__size[0xc] = '\0';
  in_RDI[1].super___mutex_base._M_mutex.__size[0xd] = '\0';
  std::function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)>::
  operator=((function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)> *
            )in_stack_ffffffffffffffd0,in_RDI);
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::operator=(in_stack_ffffffffffffffd0,in_RDI);
  std::shared_ptr<nuraft::buffer>::shared_ptr((shared_ptr<nuraft::buffer> *)0x2a5711);
  std::shared_ptr<nuraft::buffer>::operator=
            ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffffd0,
             (shared_ptr<nuraft::buffer> *)in_RDI);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2a572d);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a5737);
  return;
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> guard(lock_);
        err_ = TE();
        code_ = cmd_result_code::OK;
        has_result_ = false;
        accepted_ = false;
        handler_ = nullptr;
        handler2_ = nullptr;
        result_ = T();
    }